

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FluctuatingChargeAdapter.cpp
# Opt level: O3

void __thiscall
OpenMD::FluctuatingChargeAdapter::makeFluctuatingCharge
          (FluctuatingChargeAdapter *this,RealType chargeMass,RealType electronegativity,
          RealType hardness,int slaterN,RealType slaterZeta)

{
  DoublePolynomial *this_00;
  AtomType *this_01;
  bool bVar1;
  mapped_type_conflict *pmVar2;
  undefined1 local_c9;
  SimpleTypeData<OpenMD::FluctuatingAtypeParameters> *local_c8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_c0;
  RealType local_b8;
  mapped_type_conflict local_b0;
  RealType local_a8;
  RealType local_a0;
  shared_ptr<OpenMD::GenericData> local_98;
  FluctuatingAtypeParameters local_88;
  
  local_b8 = hardness;
  local_b0 = electronegativity;
  local_a8 = chargeMass;
  local_a0 = slaterZeta;
  bVar1 = AtomType::hasProperty(this->at_,(string *)OpenMD::FQtypeID_abi_cxx11_);
  if (bVar1) {
    AtomType::removeProperty(this->at_,(string *)OpenMD::FQtypeID_abi_cxx11_);
  }
  this_00 = &local_88.vself;
  local_88.isMetallic = false;
  local_88.usesSlaterIntramolecular = true;
  local_88.vself.polyPairMap_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_88.vself.polyPairMap_._M_t._M_impl.super__Rb_tree_header._M_header;
  local_88.vself.polyPairMap_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_88.vself.polyPairMap_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  local_88.nValence = 0.0;
  local_88.nMobile = 0.0;
  local_88.vself.polyPairMap_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_88.chargeMass = local_a8;
  local_88.electronegativity = local_b0;
  local_88.hardness = local_b8;
  local_88.slaterZeta = local_a0;
  local_c8._0_4_ = 1;
  local_88.slaterN = slaterN;
  local_88.vself.polyPairMap_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_88.vself.polyPairMap_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  pmVar2 = std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>::
           operator[](&this_00->polyPairMap_,(key_type *)&local_c8);
  *pmVar2 = local_b0;
  local_c8 = (SimpleTypeData<OpenMD::FluctuatingAtypeParameters> *)CONCAT44(local_c8._4_4_,2);
  pmVar2 = std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>::
           operator[](&this_00->polyPairMap_,(key_type *)&local_c8);
  *pmVar2 = local_b8 * 0.5;
  this_01 = this->at_;
  local_c8 = (SimpleTypeData<OpenMD::FluctuatingAtypeParameters> *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<OpenMD::SimpleTypeData<OpenMD::FluctuatingAtypeParameters>,std::allocator<OpenMD::SimpleTypeData<OpenMD::FluctuatingAtypeParameters>>,std::__cxx11::string_const&,OpenMD::FluctuatingAtypeParameters&>
            (&_Stack_c0,&local_c8,
             (allocator<OpenMD::SimpleTypeData<OpenMD::FluctuatingAtypeParameters>_> *)&local_c9,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             OpenMD::FQtypeID_abi_cxx11_,&local_88);
  local_98.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &local_c8->super_GenericData;
  local_98.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Stack_c0._M_pi;
  local_c8 = (SimpleTypeData<OpenMD::FluctuatingAtypeParameters> *)0x0;
  _Stack_c0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  AtomType::addProperty(this_01,&local_98);
  if (local_98.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_98.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (_Stack_c0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_c0._M_pi);
  }
  std::
  _Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
  ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
               *)this_00);
  return;
}

Assistant:

void FluctuatingChargeAdapter::makeFluctuatingCharge(
      RealType chargeMass, RealType electronegativity, RealType hardness,
      int slaterN, RealType slaterZeta) {
    if (isFluctuatingCharge()) { at_->removeProperty(FQtypeID); }

    FluctuatingAtypeParameters fqParam {};
    fqParam.chargeMass               = chargeMass;
    fqParam.usesSlaterIntramolecular = true;

    fqParam.electronegativity = electronegativity;
    fqParam.hardness          = hardness;
    fqParam.slaterN           = slaterN;
    fqParam.slaterZeta        = slaterZeta;

    fqParam.vself.setCoefficient(1, electronegativity);
    fqParam.vself.setCoefficient(2, 0.5 * hardness);

    at_->addProperty(std::make_shared<FluctuatingAtypeData>(FQtypeID, fqParam));
  }